

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwGetWindowFrameSize(GLFWwindow *handle,int *left,int *top,int *right,int *bottom)

{
  Atom AVar1;
  int iVar2;
  unsigned_long uVar3;
  _GLFWwindow *window;
  int *piStack_138;
  int *piStack_130;
  int *piStack_128;
  int *piStack_120;
  int *piStack_118;
  double dStack_110;
  double dStack_108;
  timeval tStack_100;
  undefined4 auStack_f0 [8];
  undefined8 uStack_d0;
  Atom AStack_c8;
  undefined4 uStack_c0;
  int iStack_94;
  
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (right != (int *)0x0) {
    *right = 0;
  }
  if (bottom != (int *)0x0) {
    *bottom = 0;
  }
  if (_glfwInitialized == '\0') {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  piStack_138 = (int *)0x0;
  if (_glfw.x11.NET_FRAME_EXTENTS != 0) {
    piStack_118 = left;
    XGetWindowAttributes(_glfw.x11.display,*(undefined8 *)(handle + 0x270),auStack_f0);
    AVar1 = _glfw.x11.NET_REQUEST_FRAME_EXTENTS;
    if (_glfw.x11.NET_REQUEST_FRAME_EXTENTS == 0 || iStack_94 == 2) {
LAB_001bcae5:
      uVar3 = _glfwGetWindowProperty
                        (*(Window *)(handle + 0x270),_glfw.x11.NET_FRAME_EXTENTS,6,
                         (uchar **)&piStack_138);
      if (uVar3 == 4) {
        if (piStack_118 != (int *)0x0) {
          *piStack_118 = *piStack_138;
        }
        if (top != (int *)0x0) {
          *top = piStack_138[4];
        }
        if (right != (int *)0x0) {
          *right = piStack_138[2];
        }
        if (bottom != (int *)0x0) {
          *bottom = piStack_138[6];
        }
      }
      if (piStack_138 != (int *)0x0) {
        XFree();
      }
    }
    else {
      piStack_130 = top;
      piStack_128 = right;
      piStack_120 = bottom;
      memset(auStack_f0,0,0xc0);
      auStack_f0[0] = 0x21;
      uStack_d0 = *(undefined8 *)(handle + 0x270);
      uStack_c0 = 0x20;
      AStack_c8 = AVar1;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,auStack_f0);
      dStack_110 = _glfwPlatformGetTime();
      dStack_110 = dStack_110 + 0.5;
      do {
        iVar2 = XCheckIfEvent(_glfw.x11.display,auStack_f0,isFrameExtentsEvent,handle);
        top = piStack_130;
        bottom = piStack_120;
        right = piStack_128;
        if (iVar2 != 0) goto LAB_001bcae5;
        dStack_108 = _glfwPlatformGetTime();
        dStack_108 = dStack_110 - dStack_108;
        if (dStack_108 <= 0.0) {
          _glfwInputError(0x10008,
                          "X11: The window manager has a broken _NET_REQUEST_FRAME_EXTENTS implementation; please report this issue"
                         );
        }
        else {
          tStack_100.tv_sec = 0;
          tStack_100.tv_usec = (__suseconds_t)(dStack_108 * 1000000.0);
          selectDisplayConnection(&tStack_100);
        }
      } while (0.0 < dStack_108);
    }
  }
  return;
}

Assistant:

GLFWAPI void glfwGetWindowFrameSize(GLFWwindow* handle,
                                    int* left, int* top,
                                    int* right, int* bottom)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;

    if (left)
        *left = 0;
    if (top)
        *top = 0;
    if (right)
        *right = 0;
    if (bottom)
        *bottom = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowFrameSize(window, left, top, right, bottom);
}